

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall Highs::writeSolution(Highs *this,string *filename,HighsInt style)

{
  bool bVar1;
  __type _Var2;
  HighsStatus HVar3;
  undefined8 uVar4;
  int in_EDX;
  string *in_RSI;
  HighsLogOptions *in_RDI;
  HighsFileType file_type;
  FILE *file;
  HighsStatus call_status;
  HighsStatus return_status;
  HighsInfo *in_stack_00000440;
  HighsSolution *in_stack_00000448;
  HighsBasis *in_stack_00000450;
  HighsModel *in_stack_00000458;
  HighsOptions *in_stack_00000460;
  FILE *in_stack_00000468;
  HighsModelStatus in_stack_000004a0;
  HighsInt in_stack_000004a8;
  HighsInt in_stack_000004e4;
  HighsRanging *in_stack_000004e8;
  HighsSolution *in_stack_000004f0;
  HighsBasis *in_stack_000004f8;
  double in_stack_00000500;
  HighsLp *in_stack_00000508;
  FILE *in_stack_00000510;
  undefined4 in_stack_fffffffffffffdf8;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffdfc;
  undefined4 in_stack_fffffffffffffe00;
  int iVar6;
  undefined4 in_stack_fffffffffffffe04;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe18;
  allocator *paVar7;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  HighsFileType *in_stack_fffffffffffffe28;
  HighsLogOptions *log_options_;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  undefined4 in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  string *in_stack_fffffffffffffe40;
  string *message;
  HighsStatus in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  Highs *in_stack_fffffffffffffe60;
  string local_198 [135];
  undefined1 local_111 [152];
  allocator local_79;
  string local_78 [32];
  string local_58 [40];
  FILE *local_30;
  HighsStatus local_24;
  HighsStatus local_20;
  int local_1c;
  HighsStatus local_4;
  
  local_20 = 0;
  local_1c = in_EDX;
  std::__cxx11::string::string(local_58,in_RSI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"writeSolution",&local_79);
  HVar3 = openWriteFile((Highs *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                        in_stack_fffffffffffffe40,
                        (string *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                        (FILE **)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                        in_stack_fffffffffffffe28);
  local_24 = HVar3;
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::__cxx11::string::~string(local_58);
  HighsLogOptions::HighsLogOptions
            ((HighsLogOptions *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
             (HighsLogOptions *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  message = (string *)local_111;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_111 + 1),"openWriteFile",(allocator *)message);
  local_20 = interpretCallStatus(in_RDI,HVar3,in_stack_fffffffffffffe48,message);
  std::__cxx11::string::~string((string *)(local_111 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_111);
  HighsLogOptions::~HighsLogOptions((HighsLogOptions *)0x498c7b);
  if (local_20 == kError) {
    local_4 = local_20;
  }
  else {
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                            (char *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    if (bVar1) {
      log_options_ = (HighsLogOptions *)&in_RDI[0x25].user_callback._M_invoker;
      uVar4 = std::__cxx11::string::c_str();
      highsLogUser(log_options_,kInfo,"Writing the solution to %s\n",uVar4);
    }
    uVar5 = *(undefined4 *)((long)&in_RDI[0x30].user_callback.super__Function_base._M_manager + 4);
    iVar6 = local_1c;
    writeSolutionFile(in_stack_00000468,in_stack_00000460,in_stack_00000458,in_stack_00000450,
                      in_stack_00000448,in_stack_00000440,in_stack_000004a0,in_stack_000004a8);
    if (local_1c == 4) {
      local_4 = returnFromWriteSolution
                          ((Highs *)CONCAT44(in_stack_fffffffffffffe04,iVar6),
                           (FILE *)CONCAT44(in_stack_fffffffffffffdfc,uVar5),kOk);
    }
    else {
      if (local_1c == 0) {
        fprintf(local_30,"\n# Basis\n");
        writeBasisFile(&in_RDI->log_stream,(HighsBasis *)CONCAT44(HVar3,in_stack_fffffffffffffe48));
      }
      _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                              in_stack_fffffffffffffe18);
      if (_Var2) {
        bVar1 = HighsModel::isMip((HighsModel *)0x498e92);
        if ((bVar1) || (bVar1 = HighsModel::isQp((HighsModel *)&in_RDI[3].log_dev_level), bVar1)) {
          highsLogUser((HighsLogOptions *)&in_RDI[0x25].user_callback._M_invoker,kError,
                       "Cannot determine ranging information for MIP or QP\n");
          local_20 = 0xffffffff;
          HVar3 = returnFromWriteSolution
                            ((Highs *)CONCAT44(in_stack_fffffffffffffe04,iVar6),
                             (FILE *)CONCAT44(in_stack_fffffffffffffdfc,uVar5),kOk);
          return HVar3;
        }
        HighsLogOptions::HighsLogOptions
                  ((HighsLogOptions *)CONCAT44(in_stack_fffffffffffffe04,iVar6),
                   (HighsLogOptions *)CONCAT44(in_stack_fffffffffffffdfc,uVar5));
        getRangingInterface(in_stack_fffffffffffffe60);
        paVar7 = (allocator *)&stack0xfffffffffffffe67;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_198,"getRangingInterface",paVar7);
        local_20 = interpretCallStatus(in_RDI,HVar3,in_stack_fffffffffffffe48,message);
        std::__cxx11::string::~string(local_198);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe67);
        HighsLogOptions::~HighsLogOptions((HighsLogOptions *)0x498faa);
        if (local_20 == kError) {
          returnFromWriteSolution
                    ((Highs *)CONCAT44(in_stack_fffffffffffffe04,iVar6),
                     (FILE *)CONCAT44(in_stack_fffffffffffffdfc,uVar5),kOk);
        }
        fprintf(local_30,"\n# Ranging\n");
        writeRangingFile(in_stack_00000510,in_stack_00000508,in_stack_00000500,in_stack_000004f8,
                         in_stack_000004f0,in_stack_000004e8,in_stack_000004e4);
      }
      local_4 = returnFromWriteSolution
                          ((Highs *)CONCAT44(in_stack_fffffffffffffe04,iVar6),
                           (FILE *)CONCAT44(in_stack_fffffffffffffdfc,uVar5),kOk);
    }
  }
  return local_4;
}

Assistant:

HighsStatus Highs::writeSolution(const std::string& filename,
                                 const HighsInt style) {
  HighsStatus return_status = HighsStatus::kOk;
  HighsStatus call_status;
  FILE* file;
  HighsFileType file_type;
  call_status = openWriteFile(filename, "writeSolution", file, file_type);
  return_status = interpretCallStatus(options_.log_options, call_status,
                                      return_status, "openWriteFile");
  if (return_status == HighsStatus::kError) return return_status;
  // Report to user that solution is being written
  if (filename != "")
    highsLogUser(options_.log_options, HighsLogType::kInfo,
                 "Writing the solution to %s\n", filename.c_str());
  writeSolutionFile(file, options_, model_, basis_, solution_, info_,
                    model_status_, style);
  if (style == kSolutionStyleSparse)
    return returnFromWriteSolution(file, return_status);
  if (style == kSolutionStyleRaw) {
    fprintf(file, "\n# Basis\n");
    writeBasisFile(file, basis_);
  }
  if (options_.ranging == kHighsOnString) {
    if (model_.isMip() || model_.isQp()) {
      highsLogUser(options_.log_options, HighsLogType::kError,
                   "Cannot determine ranging information for MIP or QP\n");
      return_status = HighsStatus::kError;
      return returnFromWriteSolution(file, return_status);
    }
    return_status =
        interpretCallStatus(options_.log_options, this->getRangingInterface(),
                            return_status, "getRangingInterface");
    if (return_status == HighsStatus::kError)
      returnFromWriteSolution(file, return_status);
    fprintf(file, "\n# Ranging\n");
    writeRangingFile(file, model_.lp_, info_.objective_function_value, basis_,
                     solution_, ranging_, style);
  }
  return returnFromWriteSolution(file, return_status);
}